

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:682:51)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:682:51)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *this_00;
  bool bVar1;
  gc_heap_ptr_untyped *this_01;
  
  this_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((this_00 ==
       (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
       super__Vector_impl_data._M_finish) || (this_00->type_ != object)) {
    bVar1 = false;
  }
  else {
    this_01 = &value::object_value(this_00)->super_gc_heap_ptr_untyped;
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::array_object>(this_01);
  }
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = bVar1;
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }